

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::CreateTilePipelineState
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this,
          TilePipelineStateCreateInfo *PSOCreateInfo,IPipelineState **ppPipelineState)

{
  string msg;
  string local_28;
  
  FormatString<char[96]>
            (&local_28,
             (char (*) [96])
             "Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature."
            );
  DebugAssertionFailed
            (local_28._M_dataplus._M_p,"CreateTilePipelineState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
             ,0x12e);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

CreateTilePipelineState(const TilePipelineStateCreateInfo& PSOCreateInfo,
                                                            IPipelineState**                   ppPipelineState) override
    {
        UNSUPPORTED("Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature.");
    }